

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O3

void __thiscall fasttext::FastText::loadVectors(FastText *this,string *filename)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  char cVar10;
  int32_t iVar11;
  uint uVar12;
  istream *piVar13;
  invalid_argument *piVar14;
  long *plVar15;
  size_type *psVar16;
  Matrix *pMVar17;
  ulong uVar18;
  long lVar19;
  EVP_PKEY_CTX *ctx;
  ulong uVar20;
  int64_t dim;
  string word;
  int64_t n;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  words;
  ifstream in;
  ulong local_340;
  undefined1 local_338 [40];
  ulong local_310;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_308;
  FastText *local_300;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  string local_298;
  string local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  istream local_238 [520];
  
  std::ifstream::ifstream(local_238,(string *)filename,_S_in);
  local_2f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cVar10 = std::__basic_file<char>::is_open();
  if (cVar10 == '\0') {
    piVar14 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_338,
                   filename," cannot be opened for loading!");
    std::invalid_argument::invalid_argument(piVar14,(string *)local_338);
    __cxa_throw(piVar14,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  piVar13 = std::istream::_M_extract<long>((long *)local_238);
  std::istream::_M_extract<long>((long *)piVar13);
  local_300 = this;
  if (local_340 ==
      (long)((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            dim) {
    local_338._0_8_ = (Matrix *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<fasttext::Matrix,std::allocator<fasttext::Matrix>,long&,long&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_338 + 8),(Matrix **)local_338,
               (allocator<fasttext::Matrix> *)&local_2b8,(long *)&local_310,(long *)&local_340);
    uVar7 = local_338._0_8_;
    local_308 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_338._8_8_;
    if (local_310 != 0) {
      uVar18 = 0;
      do {
        local_338._0_8_ = local_338 + 0x10;
        local_338._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_338._16_8_ = local_338._16_8_ & 0xffffffffffffff00;
        std::operator>>(local_238,(string *)local_338);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_2f8,(value_type *)local_338);
        Dictionary::add((this->dict_).
                        super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        (value_type *)local_338);
        if (local_340 != 0) {
          uVar20 = 0;
          do {
            std::istream::_M_extract<float>((float *)local_238);
            uVar20 = uVar20 + 1;
          } while (uVar20 < local_340);
        }
        if ((Matrix *)local_338._0_8_ != (Matrix *)(local_338 + 0x10)) {
          operator_delete((void *)local_338._0_8_);
        }
        uVar18 = uVar18 + 1;
        this = local_300;
      } while (uVar18 < local_310);
    }
    this_01 = local_308;
    std::ifstream::close();
    ctx = (EVP_PKEY_CTX *)0x1;
    Dictionary::threshold
              ((this->dict_).super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,1,0);
    Dictionary::init((this->dict_).
                     super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>._M_ptr,ctx
                    );
    iVar11 = Dictionary::nwords((this->dict_).
                                super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr);
    peVar1 = (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_2b8._M_dataplus._M_p._0_4_ = iVar11 + peVar1->bucket;
    local_338._0_8_ = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<fasttext::Matrix,std::allocator<fasttext::Matrix>,int,int&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_338 + 8),(Matrix **)local_338,
               (allocator<fasttext::Matrix> *)&local_2d8,(int *)&local_2b8,&peVar1->dim);
    uVar9 = local_338._8_8_;
    uVar8 = local_338._0_8_;
    local_338._0_8_ = (Matrix *)0x0;
    local_338._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = (this->input_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    (this->input_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)uVar8;
    (this->input_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar9;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_338._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_338._8_8_);
      }
    }
    Matrix::uniform((this->input_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,1.0 / (float)((this->args_).
                                         super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr)->dim);
    if (local_310 != 0) {
      lVar19 = 0;
      uVar18 = 0;
      do {
        uVar12 = Dictionary::getId((this->dict_).
                                   super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr,local_2f8.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start + uVar18);
        if (-1 < (int)uVar12) {
          iVar11 = Dictionary::nwords((this->dict_).
                                      super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr);
          if (((int)uVar12 < iVar11) && (local_340 != 0)) {
            peVar2 = (this->input_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
            lVar3 = peVar2->n_;
            lVar4 = (long)(peVar2->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start;
            lVar5 = *(int64_t *)(uVar7 + 0x20);
            lVar6 = *(long *)uVar7;
            uVar20 = 0;
            do {
              *(undefined4 *)((ulong)uVar12 * lVar3 * 4 + lVar4 + uVar20 * 4) =
                   *(undefined4 *)(lVar5 * lVar19 + lVar6 + uVar20 * 4);
              uVar20 = uVar20 + 1;
            } while (local_340 != uVar20);
          }
        }
        uVar18 = uVar18 + 1;
        lVar19 = lVar19 + 4;
      } while (uVar18 < local_310);
    }
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_2f8);
    std::ifstream::~ifstream(local_238);
    return;
  }
  piVar14 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&local_298,local_340);
  std::operator+(&local_258,"Dimension of pretrained vectors (",&local_298);
  plVar15 = (long *)std::__cxx11::string::append((char *)&local_258);
  local_2d8._M_dataplus._M_p = (pointer)*plVar15;
  psVar16 = (size_type *)(plVar15 + 2);
  if ((size_type *)local_2d8._M_dataplus._M_p == psVar16) {
    local_2d8.field_2._M_allocated_capacity = *psVar16;
    local_2d8.field_2._8_8_ = plVar15[3];
    local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  }
  else {
    local_2d8.field_2._M_allocated_capacity = *psVar16;
  }
  local_2d8._M_string_length = plVar15[1];
  *plVar15 = (long)psVar16;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  std::__cxx11::to_string
            (&local_278,
             ((local_300->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->dim);
  std::operator+(&local_2b8,&local_2d8,&local_278);
  plVar15 = (long *)std::__cxx11::string::append((char *)&local_2b8);
  local_338._0_8_ = *plVar15;
  pMVar17 = (Matrix *)(plVar15 + 2);
  if ((Matrix *)local_338._0_8_ == pMVar17) {
    local_338._16_8_ =
         (pMVar17->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_338._24_8_ = plVar15[3];
    local_338._0_8_ = (Matrix *)(local_338 + 0x10);
  }
  else {
    local_338._16_8_ =
         (pMVar17->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  local_338._8_8_ = plVar15[1];
  *plVar15 = (long)pMVar17;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  std::invalid_argument::invalid_argument(piVar14,(string *)local_338);
  __cxa_throw(piVar14,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void FastText::loadVectors(std::string filename) {
  std::ifstream in(filename);
  std::vector<std::string> words;
  std::shared_ptr<Matrix> mat; // temp. matrix for pretrained vectors
  int64_t n, dim;
  if (!in.is_open()) {
    throw std::invalid_argument(filename + " cannot be opened for loading!");
  }
  in >> n >> dim;
  if (dim != args_->dim) {
    throw std::invalid_argument(
        "Dimension of pretrained vectors (" + std::to_string(dim) +
        ") does not match dimension (" + std::to_string(args_->dim) + ")!");
  }
  mat = std::make_shared<Matrix>(n, dim);
  for (size_t i = 0; i < n; i++) {
    std::string word;
    in >> word;
    words.push_back(word);
    dict_->add(word);
    for (size_t j = 0; j < dim; j++) {
      in >> mat->at(i, j);
    }
  }
  in.close();

  dict_->threshold(1, 0);
  dict_->init();
  input_ = std::make_shared<Matrix>(dict_->nwords()+args_->bucket, args_->dim);
  input_->uniform(1.0 / args_->dim);

  for (size_t i = 0; i < n; i++) {
    int32_t idx = dict_->getId(words[i]);
    if (idx < 0 || idx >= dict_->nwords()) continue;
    for (size_t j = 0; j < dim; j++) {
      input_->at(idx, j) = mat->at(i, j);
    }
  }
}